

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::EquivIterator::next(EquivIterator *this)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *text;
  UBool UVar3;
  UnicodeString *this_00;
  int32_t iVar4;
  int32_t len;
  bool bVar5;
  
  this_00 = (UnicodeString *)uhash_get_63(this->_hash->hash,this->_current);
  if (this_00 == (UnicodeString *)0x0) {
LAB_002c9ac5:
    this_00 = (UnicodeString *)0x0;
  }
  else {
    text = this->_start;
    uVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (this_00->fUnion).fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      if ((((int)sVar2 & 1U) == 0) && (len == iVar4)) {
        UVar3 = UnicodeString::doEquals(this_00,text,len);
        bVar5 = UVar3 != '\0';
        goto LAB_002c9ac1;
      }
    }
    else {
      bVar5 = (bool)(*(byte *)&text->fUnion & 1);
LAB_002c9ac1:
      if (bVar5 != false) goto LAB_002c9ac5;
    }
    this->_current = this_00;
  }
  return this_00;
}

Assistant:

const icu::UnicodeString *
EquivIterator::next() {
    const icu::UnicodeString* _next = (const icu::UnicodeString*) _hash.get(*_current);
    if (_next == NULL) {
        U_ASSERT(_current == _start);
        return NULL;
    }
    if (*_next == *_start) {
        return NULL;
    }
    _current = _next;
    return _next;
}